

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  MutableType this_00;
  char *message;
  char *in_R9;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  string_view local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  TestMessageSet message_set;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  MutableType m;
  TestMessageSet *pTStack_78;
  int i;
  TestMessageSet *mset;
  undefined1 local_60 [8];
  TestMessageSet message_set_1;
  string data;
  ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes> *this_local;
  
  std::__cxx11::string::string((string *)&message_set_1.field_0._impl_._cached_size_);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet((TestMessageSet *)local_60);
  pTStack_78 = (TestMessageSet *)local_60;
  for (m._4_4_ = 0; m._4_4_ < 200; m._4_4_ = m._4_4_ + 1) {
    this_00 = proto2_wireformat_unittest::TestMessageSet::
              MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,(unsigned_char)11,false>
                        (pTStack_78,
                         (ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,_(unsigned_char)__v_,_false>
                          *)proto2_unittest::TestMessageSetExtension1::message_set_extension);
    proto2_unittest::TestMessageSetExtension1::set_i(this_00,m._4_4_);
    pTStack_78 = proto2_unittest::TestMessageSetExtension1::mutable_recursive(this_00);
  }
  proto2_wireformat_unittest::TestMessageSet::ByteSizeLong((TestMessageSet *)local_60);
  protobuf::io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&coded_output.start_count_,
             (string *)&message_set_1.field_0._impl_._cached_size_);
  protobuf::io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)&message_set.field_0._impl_._cached_size_,
             (StringOutputStream *)&coded_output.start_count_);
  WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,(TestMessageSet *)local_60,
             (CodedOutputStream *)&message_set.field_0._impl_._cached_size_);
  protobuf::io::CodedOutputStream::~CodedOutputStream
            ((CodedOutputStream *)&message_set.field_0._impl_._cached_size_);
  protobuf::io::StringOutputStream::~StringOutputStream
            ((StringOutputStream *)&coded_output.start_count_);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_60);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet((TestMessageSet *)&gtest_ar_.message_);
  local_140 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&message_set_1.field_0._impl_._cached_size_);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_140);
  local_129 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_128,
               (AssertionResult *)"message_set.ParseFromString(data)","true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x315,message);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)&gtest_ar_.message_)
  ;
  std::__cxx11::string::~string((string *)&message_set_1.field_0._impl_._cached_size_);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDeepRecReverseOrder) {
  std::string data;
  {
    typename TestFixture::TestMessageSet message_set;
    typename TestFixture::TestMessageSet* mset = &message_set;
    for (int i = 0; i < 200; i++) {
      auto m = mset->MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension);
      m->set_i(i);
      mset = m->mutable_recursive();
    }
    message_set.ByteSizeLong();
    // Serialize with reverse payload tag order
    io::StringOutputStream output_stream(&data);
    io::CodedOutputStream coded_output(&output_stream);
    this->SerializeReverseOrder(message_set, &coded_output);
  }
  typename TestFixture::TestMessageSet message_set;
  EXPECT_FALSE(message_set.ParseFromString(data));
}